

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcapi_psbt.cpp
# Opt level: O2

int CfdJoinPsbt(void *handle,void *psbt_handle,char *psbt_join_base64)

{
  bool bVar1;
  CfdException *pCVar2;
  allocator local_c9;
  string local_c8;
  Psbt join_psbt;
  
  cfd::Initialize();
  std::__cxx11::string::string((string *)&join_psbt,"PsbtHandle",(allocator *)&local_c8);
  cfd::capi::CheckBuffer(psbt_handle,(string *)&join_psbt);
  std::__cxx11::string::~string((string *)&join_psbt);
  bVar1 = cfd::capi::IsEmptyString(psbt_join_base64);
  if (bVar1) {
    join_psbt.super_Psbt._vptr_Psbt = (_func_int **)0x4fd756;
    join_psbt.super_Psbt.wally_psbt_pointer_._0_4_ = 0x1a4;
    join_psbt.super_Psbt.base_tx_.super_AbstractTransaction._vptr_AbstractTransaction =
         (_func_int **)anon_var_dwarf_7cb57e;
    cfd::core::logger::warn<>((CfdSourceLocation *)&join_psbt,"psbt_join_base64 is null or empty.");
    pCVar2 = (CfdException *)__cxa_allocate_exception(0x30);
    std::__cxx11::string::string
              ((string *)&join_psbt,"Failed to parameter. psbt_join_base64 is null or empty.",
               (allocator *)&local_c8);
    cfd::core::CfdException::CfdException(pCVar2,kCfdIllegalArgumentError,(string *)&join_psbt);
    __cxa_throw(pCVar2,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
  }
  if (*(long *)((long)psbt_handle + 0x18) != 0) {
    std::__cxx11::string::string((string *)&local_c8,psbt_join_base64,&local_c9);
    cfd::Psbt::Psbt(&join_psbt,&local_c8);
    std::__cxx11::string::~string((string *)&local_c8);
    cfd::core::Psbt::Join(*(Psbt **)((long)psbt_handle + 0x18),&join_psbt.super_Psbt,false);
    cfd::Psbt::~Psbt(&join_psbt);
    return 0;
  }
  join_psbt.super_Psbt._vptr_Psbt = (_func_int **)0x4fd756;
  join_psbt.super_Psbt.wally_psbt_pointer_._0_4_ = 0x1aa;
  join_psbt.super_Psbt.base_tx_.super_AbstractTransaction._vptr_AbstractTransaction =
       (_func_int **)anon_var_dwarf_7cb57e;
  cfd::core::logger::warn<>((CfdSourceLocation *)&join_psbt,"psbt is null.");
  pCVar2 = (CfdException *)__cxa_allocate_exception(0x30);
  std::__cxx11::string::string
            ((string *)&join_psbt,"Failed to handle statement. psbt is null.",(allocator *)&local_c8
            );
  cfd::core::CfdException::CfdException(pCVar2,kCfdIllegalStateError,(string *)&join_psbt);
  __cxa_throw(pCVar2,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
}

Assistant:

int CfdJoinPsbt(
    void* handle, void* psbt_handle, const char* psbt_join_base64) {
  int result = CfdErrorCode::kCfdUnknownError;
  try {
    cfd::Initialize();
    CheckBuffer(psbt_handle, kPrefixPsbtHandle);
    CfdCapiPsbtHandle* psbt_obj = static_cast<CfdCapiPsbtHandle*>(psbt_handle);
    if (IsEmptyString(psbt_join_base64)) {
      warn(CFD_LOG_SOURCE, "psbt_join_base64 is null or empty.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. psbt_join_base64 is null or empty.");
    }
    if (psbt_obj->psbt == nullptr) {
      warn(CFD_LOG_SOURCE, "psbt is null.");
      throw CfdException(
          CfdError::kCfdIllegalStateError,
          "Failed to handle statement. psbt is null.");
    }

    Psbt join_psbt(psbt_join_base64);
    psbt_obj->psbt->Join(join_psbt);
    return CfdErrorCode::kCfdSuccess;
  } catch (const CfdException& except) {
    result = SetLastError(handle, except);
  } catch (const std::exception& std_except) {
    SetLastFatalError(handle, std_except.what());
  } catch (...) {
    SetLastFatalError(handle, "unknown error.");
  }
  return result;
}